

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution_x86::forwardDilation
          (Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,conv_func conv)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  size_t sVar4;
  ulong uVar5;
  Mat *pMVar6;
  int iVar7;
  void *pvVar8;
  ulong uVar9;
  int iVar10;
  void *pvVar11;
  undefined4 *puVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  undefined4 *puVar18;
  long lVar19;
  ulong uVar20;
  undefined4 *puVar21;
  uint uVar22;
  int iVar23;
  size_t sVar24;
  ulong uVar25;
  undefined1 auVar26 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  Mat local_100;
  ulong local_d0;
  Mat *local_c8;
  ulong local_c0;
  int local_b8;
  int local_b4;
  ulong local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  ulong local_88;
  long local_80;
  long local_78;
  Mat *local_70;
  Mat *local_68;
  Mat *local_60;
  conv_func local_58;
  ulong local_50;
  ulong local_48;
  long local_40;
  long local_38;
  
  uVar22 = bottom_blob->w;
  uVar9 = (ulong)uVar22;
  iVar16 = bottom_blob->h;
  uVar13 = (this->super_Convolution).kernel_w;
  local_b0 = (ulong)uVar13;
  uVar1 = (this->super_Convolution).dilation_w;
  uVar20 = (ulong)uVar1;
  iVar2 = (this->super_Convolution).stride_w;
  local_100.data = bottom_blob->data;
  local_100.refcount = bottom_blob->refcount;
  local_100.elemsize = bottom_blob->elemsize;
  local_100.dims = bottom_blob->dims;
  local_100.h = iVar16;
  local_100.w = uVar22;
  if (local_100.refcount != (int *)0x0) {
    LOCK();
    *local_100.refcount = *local_100.refcount + 1;
    UNLOCK();
    local_100.w = bottom_blob->w;
    local_100.h = bottom_blob->h;
  }
  iVar23 = (uVar13 - 1) * uVar1;
  local_100.c = bottom_blob->c;
  local_100.cstep = bottom_blob->cstep;
  iVar10 = (this->super_Convolution).pad_w;
  iVar7 = (this->super_Convolution).pad_h;
  local_58 = conv;
  if (iVar7 < 1 && iVar10 < 1) {
    if (iVar7 == -0xe9 && iVar10 == -0xe9) {
      iVar7 = iVar23 - (int)(uVar22 - 1) % iVar2;
      iVar10 = iVar23 - (iVar16 + -1) % iVar2;
      if ((0 < iVar7) || (uVar9 = (ulong)(uint)local_100.w, iVar16 = local_100.h, 0 < iVar10)) {
        copy_make_border(bottom_blob,&local_100,iVar10 / 2,iVar10 - iVar10 / 2,iVar7 / 2,
                         iVar7 - iVar7 / 2,0,0.0);
        goto LAB_0010af0b;
      }
    }
  }
  else {
    copy_make_border(bottom_blob,&local_100,iVar7,iVar7,iVar10,iVar10,0,0.0);
LAB_0010af0b:
    iVar16 = -100;
    if ((local_100.data == (void *)0x0) || ((long)local_100.c * local_100.cstep == 0))
    goto LAB_0010b6a2;
    uVar9 = (ulong)(uint)local_100.w;
    iVar16 = local_100.h;
  }
  iVar15 = ((int)uVar9 - (iVar23 + 1)) / iVar2 + 1;
  iVar23 = (iVar16 - (iVar23 + 1)) / iVar2 + 1;
  iVar10 = (this->super_Convolution).num_output;
  auVar26._0_4_ = -(uint)(top_blob->dims == 3);
  auVar26._4_4_ = -(uint)(iVar15 == top_blob->w);
  auVar26._8_4_ = -(uint)(iVar23 == top_blob->h);
  auVar26._12_4_ = -(uint)(iVar10 == top_blob->c);
  iVar7 = movmskps(3,auVar26);
  local_c8 = bottom_blob;
  local_c0 = uVar9;
  if ((iVar7 == 0xf) && (top_blob->elemsize == 4)) {
    if (top_blob->data != (void *)0x0) {
      sVar24 = top_blob->cstep;
LAB_0010b0c4:
      if ((long)iVar10 * sVar24 != 0) {
        local_118 = (undefined1  [16])0x0;
        local_128 = (undefined1  [16])0x0;
        local_138 = (undefined1  [16])0x0;
        local_148 = (undefined1  [16])0x0;
        local_158 = (undefined1  [16])0x0;
        local_168 = (undefined1  [16])0x0;
        iVar10 = (int)uVar20;
        if (iVar10 < 1) {
          iVar16 = 0;
        }
        else {
          iVar7 = (int)local_c0;
          local_b4 = iVar10 + iVar7 + -1;
          local_b8 = iVar10 + -1 + iVar16;
          local_60 = &(this->super_Convolution).weight_data;
          local_68 = &(this->super_Convolution).bias_data;
          local_98 = (long)iVar7 << 2;
          local_c0 = (ulong)(uint)(iVar7 * iVar10);
          local_90 = (long)iVar15 << 2;
          local_38 = (long)(iVar15 * iVar10) << 2;
          lVar17 = 0;
          lVar19 = 0;
          uVar9 = 0;
          local_d0 = uVar20;
          local_70 = top_blob;
          do {
            uVar5 = (long)(local_b8 - (int)uVar9) / (long)(int)local_d0;
            iVar16 = (int)uVar5;
            uVar14 = (long)(iVar16 - (int)local_b0) / (long)iVar2;
            local_48 = uVar14 & 0xffffffff;
            uVar22 = (int)uVar14 + 1;
            uVar14 = 0;
            local_a8 = lVar17;
            local_a0 = lVar19;
            local_88 = uVar9;
            local_80 = lVar19;
            local_78 = lVar17;
            do {
              uVar9 = (long)(local_b4 - (int)uVar14) / (long)(int)local_d0;
              iVar7 = (int)uVar9;
              iVar10 = (iVar7 - (int)local_b0) / iVar2;
              local_50 = uVar14;
              if ((local_128._12_4_ != iVar7) || (local_118._0_4_ != iVar16)) {
                iVar23 = local_c8->c;
                if ((local_128._12_4_ == iVar7) &&
                   ((((local_128._8_4_ == 3 && (local_118._0_4_ == iVar16)) &&
                     (local_118._4_4_ == iVar23)) && (local_128._0_8_ == 4)))) {
                  if ((void *)local_138._0_8_ != (void *)0x0) {
                    uVar14 = local_118._8_8_;
LAB_0010b34a:
                    if ((long)iVar23 * uVar14 != 0) goto LAB_0010b35a;
                  }
                }
                else {
                  if ((int *)local_138._8_8_ != (int *)0x0) {
                    LOCK();
                    *(int *)local_138._8_8_ = *(int *)local_138._8_8_ + -1;
                    UNLOCK();
                    if ((*(int *)local_138._8_8_ == 0) && ((void *)local_138._0_8_ != (void *)0x0))
                    {
                      free(*(void **)(local_138._0_8_ + -8));
                    }
                  }
                  local_138 = (undefined1  [16])0x0;
                  local_128._8_4_ = 3;
                  local_128._0_8_ = 4;
                  local_128._12_4_ = iVar7;
                  local_118._4_4_ = iVar23;
                  local_118._0_4_ = iVar16;
                  uVar14 = (long)(iVar16 * iVar7) + 3U & 0x3ffffffffffffffc;
                  local_118._8_8_ = uVar14;
                  lVar17 = (long)iVar23 * uVar14;
                  if (lVar17 != 0) {
                    pvVar8 = malloc(lVar17 * 4 + 0x1c);
                    local_138._0_8_ = (long)pvVar8 + 0x17U & 0xfffffffffffffff0;
                    *(void **)(local_138._0_8_ - 8) = pvVar8;
                    local_138._8_8_ = local_138._0_8_ + lVar17 * 4;
                    *(undefined4 *)local_138._8_8_ = 1;
                    iVar23 = local_118._4_4_;
                    goto LAB_0010b34a;
                  }
                }
                goto LAB_0010b6de;
              }
LAB_0010b35a:
              pMVar6 = local_c8;
              uVar13 = iVar10 + 1;
              if ((local_158._12_4_ != uVar13) || (local_148._0_4_ != uVar22)) {
                iVar23 = (this->super_Convolution).num_output;
                if (((local_158._12_4_ == uVar13) &&
                    (((local_158._8_4_ == 3 && (local_148._0_4_ == uVar22)) &&
                     (local_148._4_4_ == iVar23)))) && (local_158._0_8_ == 4)) {
                  if ((void *)local_168._0_8_ != (void *)0x0) {
                    uVar14 = local_148._8_8_;
LAB_0010b482:
                    if ((long)iVar23 * uVar14 != 0) goto LAB_0010b492;
                  }
                }
                else {
                  if ((int *)local_168._8_8_ != (int *)0x0) {
                    LOCK();
                    *(int *)local_168._8_8_ = *(int *)local_168._8_8_ + -1;
                    UNLOCK();
                    if ((*(int *)local_168._8_8_ == 0) && ((void *)local_168._0_8_ != (void *)0x0))
                    {
                      free(*(void **)(local_168._0_8_ + -8));
                    }
                  }
                  local_168 = (undefined1  [16])0x0;
                  local_158._8_4_ = 3;
                  local_158._0_8_ = 4;
                  local_158._12_4_ = uVar13;
                  local_148._4_4_ = iVar23;
                  local_148._0_4_ = uVar22;
                  uVar14 = (long)(int)(uVar22 * uVar13) + 3U & 0x3ffffffffffffffc;
                  local_148._8_8_ = uVar14;
                  lVar17 = (long)iVar23 * uVar14;
                  if (lVar17 != 0) {
                    pvVar8 = malloc(lVar17 * 4 + 0x1c);
                    local_168._0_8_ = (long)pvVar8 + 0x17U & 0xfffffffffffffff0;
                    *(void **)(local_168._0_8_ - 8) = pvVar8;
                    local_168._8_8_ = local_168._0_8_ + lVar17 * 4;
                    *(undefined4 *)local_168._8_8_ = 1;
                    iVar23 = local_148._4_4_;
                    goto LAB_0010b482;
                  }
                }
LAB_0010b6de:
                iVar16 = -100;
                goto LAB_0010b722;
              }
LAB_0010b492:
              iVar23 = pMVar6->c;
              if (0 < (long)iVar23) {
                lVar17 = (long)local_100.data + local_a0;
                local_40 = local_100.cstep * local_100.elemsize;
                lVar19 = 0;
                pvVar8 = (void *)local_138._0_8_;
                do {
                  if (0 < iVar16) {
                    iVar15 = 0;
                    uVar14 = 0;
                    pvVar11 = pvVar8;
                    do {
                      if (0 < iVar7) {
                        puVar12 = (undefined4 *)(lVar17 + (long)iVar15 * 4);
                        uVar25 = 0;
                        do {
                          *(undefined4 *)((long)pvVar11 + uVar25 * 4) = *puVar12;
                          uVar25 = uVar25 + 1;
                          puVar12 = puVar12 + uVar20;
                        } while ((uVar9 & 0xffffffff) != uVar25);
                      }
                      uVar14 = uVar14 + 1;
                      iVar15 = iVar15 + (int)local_c0;
                      pvVar11 = (void *)((long)pvVar11 + (long)iVar7 * 4);
                    } while (uVar14 != (uVar5 & 0xffffffff));
                  }
                  lVar19 = lVar19 + 1;
                  lVar17 = lVar17 + local_40;
                  pvVar8 = (void *)((long)pvVar8 + local_118._8_8_ * local_128._0_8_);
                } while (lVar19 != iVar23);
              }
              (*local_58)((Mat *)local_138,(Mat *)local_168,local_60,local_68);
              lVar17 = (long)(this->super_Convolution).num_output;
              if (0 < lVar17) {
                sVar24 = local_70->cstep;
                puVar12 = (undefined4 *)((long)local_70->data + local_a8);
                sVar4 = local_70->elemsize;
                lVar19 = 0;
                pvVar8 = (void *)local_168._0_8_;
                do {
                  if (-1 < (int)local_48) {
                    uVar9 = 0;
                    puVar18 = puVar12;
                    pvVar11 = pvVar8;
                    do {
                      if (-1 < iVar10) {
                        uVar14 = 0;
                        puVar21 = puVar18;
                        do {
                          *puVar21 = *(undefined4 *)((long)pvVar11 + uVar14 * 4);
                          uVar14 = uVar14 + 1;
                          puVar21 = puVar21 + uVar20;
                        } while (uVar13 != uVar14);
                      }
                      uVar9 = uVar9 + 1;
                      puVar18 = (undefined4 *)((long)puVar18 + local_38);
                      pvVar11 = (void *)((long)pvVar11 + (long)(int)uVar13 * 4);
                    } while (uVar9 != uVar22);
                  }
                  lVar19 = lVar19 + 1;
                  puVar12 = (undefined4 *)((long)puVar12 + sVar24 * sVar4);
                  pvVar8 = (void *)((long)pvVar8 + local_148._8_8_ * local_158._0_8_);
                } while (lVar19 != lVar17);
              }
              uVar14 = local_50 + 1;
              local_a0 = local_a0 + 4;
              local_a8 = local_a8 + 4;
            } while (uVar14 != local_d0);
            uVar9 = local_88 + 1;
            lVar19 = local_80 + local_98;
            lVar17 = local_78 + local_90;
            iVar16 = 0;
          } while (uVar9 != local_d0);
        }
LAB_0010b722:
        if ((int *)local_168._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_168._8_8_ = *(int *)local_168._8_8_ + -1;
          UNLOCK();
          if ((*(int *)local_168._8_8_ == 0) && ((void *)local_168._0_8_ != (void *)0x0)) {
            free(*(void **)(local_168._0_8_ + -8));
          }
        }
        if ((int *)local_138._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_138._8_8_ = *(int *)local_138._8_8_ + -1;
          UNLOCK();
          if ((*(int *)local_138._8_8_ == 0) && ((void *)local_138._0_8_ != (void *)0x0)) {
            free(*(void **)(local_138._0_8_ + -8));
          }
        }
        goto LAB_0010b6a2;
      }
    }
  }
  else {
    piVar3 = top_blob->refcount;
    local_d0 = uVar20;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if ((*piVar3 == 0) && (top_blob->data != (void *)0x0)) {
        free(*(void **)((long)top_blob->data + -8));
      }
    }
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    top_blob->elemsize = 4;
    top_blob->dims = 3;
    top_blob->w = iVar15;
    top_blob->h = iVar23;
    top_blob->c = iVar10;
    sVar24 = (long)(iVar23 * iVar15) + 3U & 0x3ffffffffffffffc;
    top_blob->cstep = sVar24;
    lVar17 = (long)iVar10 * sVar24;
    if (lVar17 != 0) {
      pvVar8 = malloc(lVar17 * 4 + 0x1c);
      pvVar11 = (void *)((long)pvVar8 + 0x17U & 0xfffffffffffffff0);
      *(void **)((long)pvVar11 - 8) = pvVar8;
      top_blob->data = pvVar11;
      piVar3 = (int *)((long)pvVar11 + lVar17 * 4);
      top_blob->refcount = piVar3;
      *piVar3 = 1;
      iVar10 = top_blob->c;
      uVar20 = local_d0;
      goto LAB_0010b0c4;
    }
  }
  iVar16 = -100;
LAB_0010b6a2:
  if (local_100.refcount != (int *)0x0) {
    LOCK();
    *local_100.refcount = *local_100.refcount + -1;
    UNLOCK();
    if ((*local_100.refcount == 0) && (local_100.data != (void *)0x0)) {
      free(*(void **)((long)local_100.data + -8));
    }
  }
  return iVar16;
}

Assistant:

int Convolution_x86::forwardDilation(const Mat& bottom_blob, Mat& top_blob, conv_func conv) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;

    const int kernel_size = kernel_w;
    const int stride = stride_w;
    const int dilation = dilation_w;
    const int kernel_extent = dilation * (kernel_size - 1) + 1;

    Mat bottom_blob_bordered = bottom_blob;
    if (pad_w > 0 || pad_h > 0)
    {
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_h, pad_h, pad_w, pad_w, BORDER_CONSTANT, 0.f);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_w == -233 && pad_h == -233)
    {
        int wpad = kernel_extent + (w - 1) / stride * stride - w;
        int hpad = kernel_extent + (h - 1) / stride * stride - h;
        if (wpad > 0 || hpad > 0)
        {
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, 0.f);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_extent) / stride + 1;
    int outh = (h - kernel_extent) / stride + 1;

    top_blob.create(outw, outh, num_output);
    if (top_blob.empty())
        return -100;

    // Make (dilation * dilation) batches
    Mat inner_bottom_blob;
    Mat inner_top_blob;
    for (int x = 0; x < dilation; x ++)
    {
        for (int y = 0; y < dilation; y ++)
        {
            int inner_w = (w - y + dilation - 1) / dilation;
            int inner_h = (h - x + dilation - 1) / dilation;

            int inner_outw = (inner_w - kernel_size) / stride + 1;
            int inner_outh = (inner_h - kernel_size) / stride + 1;

            if (inner_bottom_blob.w != inner_w || inner_bottom_blob.h != inner_h)
            {
                inner_bottom_blob.create(inner_w, inner_h, bottom_blob.c);

                if (inner_bottom_blob.empty())
                {
                    return -100;
                }
            }

            if (inner_top_blob.w != inner_outw || inner_top_blob.h != inner_outh)
            {
                inner_top_blob.create(inner_outw, inner_outh, num_output);

                if (inner_top_blob.empty())
                {
                    return -100;
                }
            }

            #pragma omp parallel for
            for (int c = 0; c < bottom_blob.c; c ++)
            {
                float *outptr = inner_bottom_blob.channel(c);

                for (int i = 0; i < inner_h; i ++)
                {
                    const float* ptr = (const float *)bottom_blob_bordered.channel(c) + dilation * i * w + x * w + y;
                    for (int j = 0; j < inner_w; j ++)
                    {
                        outptr[j] = ptr[j*dilation];
                    }
                    outptr += inner_w;
                }
            }

            conv(inner_bottom_blob, inner_top_blob, weight_data, bias_data);

            #pragma omp parallel for
            for (int c = 0; c < num_output; c ++)
            {
                float *outptr = (float *)top_blob.channel(c) + x * outw + y;
                for (int i = 0; i < inner_outh; i ++)
                {
                    const float* ptr = (const float *)inner_top_blob.channel(c) + i * inner_outw;
                    for (int j = 0; j < inner_outw; j ++)
                    {
                        outptr[j*dilation] = ptr[j];
                    }
                    outptr += dilation * outw;
                }
            }
        }
    }

    return 0;
}